

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool string_count(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  int iVar1;
  gravity_fiber_t *fiber;
  undefined6 in_register_00000012;
  ulong uVar2;
  int iVar3;
  int iVar4;
  _Bool _Var5;
  gravity_value_t value;
  gravity_value_t value_00;
  char _buffer [4096];
  char local_1018 [4096];
  
  if (((int)CONCAT62(in_register_00000012,nargs) == 2) && (args[1].isa == gravity_class_string)) {
    iVar3 = 0;
    iVar4 = 0;
    for (uVar2 = 0; *(uint *)((long)&((args->field_1).p)->identifier + 4) != uVar2;
        uVar2 = uVar2 + 1) {
      iVar1 = 0;
      if (*(char *)((long)&((args->field_1).p)->objclass->isa + uVar2) ==
          *(char *)((long)&(args[1].field_1.p)->objclass->isa + (long)iVar4)) {
        if (iVar4 == *(int *)((long)&(args[1].field_1.p)->identifier + 4) + -1) {
          iVar3 = iVar3 + 1;
          iVar1 = 0;
        }
        else {
          iVar1 = iVar4 + 1;
        }
      }
      iVar4 = iVar1;
    }
    value_00.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)iVar3;
    value_00.isa = gravity_class_int;
    gravity_vm_setslot(vm,value_00,rindex);
    _Var5 = true;
  }
  else {
    builtin_strncpy(local_1018 + 0x10,"xpects a string as an argument",0x1f);
    builtin_strncpy(local_1018,"String.count() e",0x10);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1018);
    _Var5 = false;
    value.field_1.n = 0;
    value.isa = gravity_class_null;
    gravity_vm_setslot(vm,value,rindex);
  }
  return _Var5;
}

Assistant:

static bool string_count (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm)

    if ((nargs != 2) || (!VALUE_ISA_STRING(GET_VALUE(1)))) {
        RETURN_ERROR("String.count() expects a string as an argument");
    }

    gravity_string_t *main_str = VALUE_AS_STRING(GET_VALUE(0));
    gravity_string_t *str_to_count = VALUE_AS_STRING(GET_VALUE(1));

    int j = 0;
    int count = 0;

    // iterate through whole string
    for (int i = 0; i < main_str->len; ++i) {
        if (main_str->s[i] == str_to_count->s[j]) {
            // if the characters match and we are on the last character of the search
            // string, then we have found a match
            if (j == str_to_count->len - 1) {
                ++count;
                j = 0;
                continue;
            }
        }
        // reset if it isn't a match
        else {
            j = 0;
            continue;
        }
        // move forward in the search string if we found a match but we aren't
        // finished checking all the characters of the search string yet
        ++j;
    }

    RETURN_VALUE(VALUE_FROM_INT(count), rindex);
}